

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

logical pnga_locate(Integer g_a,Integer *subscript,Integer *owner)

{
  long lVar1;
  C_Integer *pCVar2;
  long lVar3;
  global_array_t *pgVar4;
  ulong uVar5;
  logical lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long *plVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  Integer proc_s [7];
  
  lVar1 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar1)) {
    sprintf((char *)proc_s,"%s: INVALID ARRAY HANDLE","nga_locate");
    pnga_error((char *)proc_s,g_a);
  }
  if (GA[lVar1].actv == 0) {
    sprintf((char *)proc_s,"%s: ARRAY NOT ACTIVE","nga_locate");
    pnga_error((char *)proc_s,g_a);
  }
  pgVar4 = GA;
  lVar13 = (long)GA[lVar1].ndim;
  if (GA[lVar1].distr_type == 0) {
    *owner = -1;
    lVar6 = 0;
    lVar9 = 0;
    if (0 < lVar13) {
      lVar9 = lVar13;
    }
    lVar7 = 0;
    do {
      if (lVar9 == lVar7) {
        lVar7 = 0;
        lVar16 = 0;
        goto LAB_0015a3f9;
      }
      plVar10 = subscript + lVar7;
    } while ((0 < *plVar10) &&
            (pCVar2 = pgVar4[g_a + 1000].dims + lVar7, lVar7 = lVar7 + 1, *plVar10 <= *pCVar2));
  }
  else {
    uVar12 = (uint)GA[lVar1].ndim;
    if (GA[lVar1].distr_type == 4) {
      uVar5 = 0;
      uVar8 = 0;
      if (0 < (int)uVar12) {
        uVar8 = (ulong)uVar12;
      }
      pCVar2 = GA[lVar1].mapc;
      lVar13 = 0;
      for (; uVar5 != uVar8; uVar5 = uVar5 + 1) {
        lVar9 = subscript[uVar5];
        uVar14 = (uint)((double)lVar9 * GA[lVar1].scale[uVar5]);
        lVar7 = GA[lVar1].num_blocks[uVar5];
        uVar11 = (int)lVar7 - 1;
        if (lVar7 == (int)uVar14) {
          uVar14 = uVar11;
        }
        if (lVar9 < pCVar2[lVar13 + (int)uVar14]) {
          plVar10 = pCVar2 + lVar13 + ((ulong)uVar14 - 1);
          do {
            uVar20 = uVar11;
            if ((int)uVar14 < 1) break;
            uVar14 = uVar14 - 1;
            lVar16 = *plVar10;
            plVar10 = plVar10 + -1;
            uVar20 = uVar14;
          } while (lVar9 < lVar16);
        }
        else {
          uVar19 = uVar14 - 1;
          lVar16 = (long)(int)uVar14;
          do {
            uVar20 = uVar11;
            if (lVar7 + -1 <= lVar16) break;
            uVar19 = uVar19 + 1;
            lVar15 = lVar13 + lVar16;
            lVar16 = lVar16 + 1;
            uVar20 = uVar19;
          } while ((pCVar2 + 1)[lVar15] <= lVar9);
        }
        proc_s[uVar5] = (long)(int)uVar20;
        lVar13 = lVar13 + lVar7;
      }
    }
    else {
      uVar5 = 0;
      uVar8 = 0;
      if (0 < (int)uVar12) {
        uVar8 = (ulong)uVar12;
      }
      for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
        proc_s[uVar5] = (subscript[uVar5] + -1) / GA[g_a + 1000].block_dims[uVar5];
      }
    }
    lVar13 = proc_s[(long)(int)uVar12 + -1];
    for (uVar12 = uVar12 - 2; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
      lVar13 = lVar13 * GA[lVar1].num_blocks[uVar12] + proc_s[uVar12];
    }
    *owner = lVar13;
    lVar6 = 1;
  }
  return lVar6;
LAB_0015a3f9:
  if (lVar16 == lVar9) {
    lVar16 = 0;
    lVar7 = 1;
    for (lVar15 = 0; lVar9 != lVar15; lVar15 = lVar15 + 1) {
      lVar17 = lVar7;
      if (lVar15 < lVar13 + -1) {
        lVar17 = pgVar4[g_a + 1000].nblock[lVar15] * lVar7;
      }
      lVar16 = lVar16 + lVar7 * proc_s[lVar15];
      lVar7 = lVar17;
    }
    *owner = lVar16;
    if (pgVar4[lVar1].num_rstrctd < 1) {
      return 1;
    }
    *owner = pgVar4[lVar1].rstrctd_list[lVar16];
    return 1;
  }
  lVar15 = subscript[lVar16];
  pCVar2 = pgVar4[lVar1].mapc;
  uVar14 = (uint)((double)lVar15 * pgVar4[lVar1].scale[lVar16]);
  uVar12 = pgVar4[lVar1].nblock[lVar16];
  uVar5 = (long)(int)uVar12 - 1;
  uVar8 = (ulong)uVar14;
  if (uVar12 == uVar14) {
    uVar8 = uVar5 & 0xffffffff;
  }
  iVar18 = (int)uVar8;
  if (lVar15 < pCVar2[lVar7 + iVar18]) {
    plVar10 = pCVar2 + lVar7 + uVar8;
    do {
      plVar10 = plVar10 + -1;
      if ((int)uVar8 < 1) goto LAB_0015a495;
      uVar14 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar14;
    } while (lVar15 < *plVar10);
  }
  else {
    uVar14 = iVar18 - 1;
    lVar17 = (long)iVar18;
    do {
      if ((long)uVar5 <= lVar17) goto LAB_0015a495;
      uVar14 = uVar14 + 1;
      lVar3 = lVar17 + 1;
      lVar17 = lVar17 + 1;
    } while (pCVar2[lVar7 + lVar3] <= lVar15);
  }
  goto LAB_0015a498;
LAB_0015a495:
  uVar14 = (uint)uVar5;
LAB_0015a498:
  proc_s[lVar16] = (long)(int)uVar14;
  lVar7 = lVar7 + (int)uVar12;
  lVar16 = lVar16 + 1;
  goto LAB_0015a3f9;
}

Assistant:

logical pnga_locate(Integer g_a, Integer* subscript, Integer* owner)
{
Integer d, proc, dpos, ndim, ga_handle = GA_OFFSET + g_a, proc_s[MAXDIM];

   ga_check_handleM(g_a, "nga_locate");
   ndim = GA[ga_handle].ndim;

   if (GA[ga_handle].distr_type == REGULAR) {
     for(d=0, *owner=-1; d< ndim; d++) 
       if(subscript[d]< 1 || subscript[d]>GA[ga_handle].dims[d]) return FALSE;

     for(d = 0, dpos = 0; d< ndim; d++){
       findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d],
           GA[ga_handle].scale[d], subscript[d], &proc_s[d]);
       dpos += GA[ga_handle].nblock[d];
     }

     ga_ComputeIndexM(&proc, ndim, proc_s, GA[ga_handle].nblock); 

     *owner = proc;
     if (GA[ga_handle].num_rstrctd > 0) {
       *owner = GA[ga_handle].rstrctd_list[*owner];
     }
   } else {
     Integer i;
     Integer index[MAXDIM];
     gam_find_block_indices_from_subscript(ga_handle,subscript,index);
     gam_find_block_from_indices(ga_handle,i,index);    
     *owner = i;
   }
   
   return TRUE;
}